

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  xml_attribute_struct *pxVar1;
  char *pcVar2;
  xml_attribute xVar3;
  char_t *unaff_RBX;
  xml_node_struct *pxVar4;
  char_t *pcVar5;
  size_t sVar6;
  namespace_uri_predicate pred;
  namespace_uri_predicate pred_00;
  xml_node p;
  xml_node local_38;
  
  pxVar1 = (node->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    pxVar4 = (node->_node)._root;
    pcVar5 = "";
    if (pxVar4 != (xml_node_struct *)0x0) {
      pcVar5 = "";
      if (pxVar4->name != (char_t *)0x0) {
        pcVar5 = pxVar4->name;
      }
    }
    pcVar2 = strchr((char *)pcVar5,0x3a);
    sVar6 = (long)pcVar2 - (long)pcVar5;
    local_38._root = pxVar4;
    if (pcVar2 == (char *)0x0) {
      sVar6 = 0;
      pcVar5 = (char_t *)0x0;
    }
    do {
      if (pxVar4 == (xml_node_struct *)0x0) {
        return "";
      }
      pred_00.prefix_length = sVar6;
      pred_00.prefix = pcVar5;
      xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                        (&local_38,pred_00);
      if (xVar3._attr == (xml_attribute_struct *)0x0) {
        pxVar4 = pxVar4->parent;
        local_38._root = pxVar4;
      }
      else {
        unaff_RBX = (xVar3._attr)->value;
        if (unaff_RBX == (char_t *)0x0) {
          unaff_RBX = "";
        }
      }
    } while (xVar3._attr == (xml_attribute_struct *)0x0);
  }
  else {
    pcVar5 = pxVar1->name;
    unaff_RBX = "";
    if (pcVar5 == (char_t *)0x0) {
      pcVar5 = "";
    }
    pcVar2 = strchr((char *)pcVar5,0x3a);
    if (pcVar2 != (char *)0x0) {
      pxVar4 = (node->_node)._root;
      local_38._root = pxVar4;
      do {
        if (pxVar4 == (xml_node_struct *)0x0) {
          return "";
        }
        pred.prefix_length = (long)pcVar2 - (long)pcVar5;
        pred.prefix = pcVar5;
        xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                          (&local_38,pred);
        if (xVar3._attr == (xml_attribute_struct *)0x0) {
          pxVar4 = pxVar4->parent;
          local_38._root = pxVar4;
        }
        else {
          unaff_RBX = (xVar3._attr)->value;
          if (unaff_RBX == (char_t *)0x0) {
            unaff_RBX = "";
          }
        }
      } while (xVar3._attr == (xml_attribute_struct *)0x0);
    }
  }
  return unaff_RBX;
}

Assistant:

PUGI__FN const char_t* namespace_uri(const xpath_node& node)
	{
		return node.attribute() ? namespace_uri(node.attribute(), node.parent()) : namespace_uri(node.node());
	}